

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbasematrix.h
# Opt level: O2

bool __thiscall
TPZMatrix<std::complex<long_double>_>::CompareValues
          (TPZMatrix<std::complex<long_double>_> *this,TPZMatrix<std::complex<long_double>_> *M,
          complex<long_double> tol)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  complex<long_double> *__z;
  int64_t j;
  long lVar5;
  long lVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined4 uStack_8e;
  undefined2 uStack_8a;
  undefined8 local_88;
  undefined2 uStack_80;
  undefined4 uStack_7e;
  undefined2 uStack_7a;
  longdouble local_78;
  undefined4 local_6e;
  undefined2 local_6a;
  longdouble local_68;
  undefined4 local_5e;
  undefined2 local_5a;
  longdouble local_58;
  longdouble local_48;
  
  lVar3 = (this->super_TPZBaseMatrix).fRow;
  bVar2 = false;
  if (((M->super_TPZBaseMatrix).fRow == lVar3) &&
     (lVar4 = (this->super_TPZBaseMatrix).fCol, bVar2 = false,
     (M->super_TPZBaseMatrix).fCol == lVar4)) {
    lVar6 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar6;
    }
    if (lVar3 < 1) {
      lVar3 = lVar6;
    }
    for (; lVar6 != lVar3; lVar6 = lVar6 + 1) {
      lVar5 = 0;
      while (lVar4 != lVar5) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                  (&local_78,this,lVar6,lVar5);
        __z = (complex<long_double> *)M;
        (*(M->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(&local_58,M,lVar6,lVar5)
        ;
        uStack_8a = local_6a;
        uStack_8e = local_6e;
        uStack_7a = local_5a;
        uStack_7e = local_5e;
        local_98 = SUB108(local_78 - local_58,0);
        uStack_90 = (undefined2)((unkuint10)(local_78 - local_58) >> 0x40);
        local_88 = SUB108(local_68 - local_48,0);
        uStack_80 = (undefined2)((unkuint10)(local_68 - local_48) >> 0x40);
        lVar8 = in_ST4;
        lVar7 = in_ST4;
        std::abs<long_double>((longdouble *)&local_98,__z);
        dVar1 = (double)in_ST0;
        local_88 = tol._M_value._16_8_;
        uStack_80 = tol._M_value._24_2_;
        uStack_7e = tol._M_value._26_4_;
        uStack_7a = tol._M_value._30_2_;
        local_98 = tol._M_value._0_8_;
        uStack_90 = tol._M_value._8_2_;
        uStack_8e = tol._M_value._10_4_;
        uStack_8a = tol._M_value._14_2_;
        in_ST0 = in_ST2;
        in_ST2 = in_ST4;
        in_ST4 = lVar7;
        std::abs<long_double>((longdouble *)&local_98,__z);
        lVar7 = ABS(in_ST1);
        lVar5 = lVar5 + 1;
        in_ST1 = in_ST3;
        in_ST3 = lVar8;
        if (lVar7 < (longdouble)ABS(dVar1)) {
          return false;
        }
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline int64_t Rows() const { return fRow; }